

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

QString * __thiscall QTextDocument::toMarkdown(QTextDocument *this,MarkdownFeatures features)

{
  bool bVar1;
  QTextDocument *in_RSI;
  QTextMarkdownWriter *in_RDI;
  long in_FS_OFFSET;
  QTextStream s;
  QString ret;
  QTextMarkdownWriter w;
  QTextMarkdownWriter *this_00;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uint local_94;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 local_60 [88];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QString::QString((QString *)0x7bb55e);
  local_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)this_00,(OpenModeFlag)((ulong)in_RDI >> 0x20));
  QTextStream::QTextStream
            ((QTextStream *)&local_90,(QString *)&local_80,(QFlags_conflict *)(ulong)local_94);
  memset(local_60,0xaa,0x58);
  QTextMarkdownWriter::QTextMarkdownWriter
            (this_00,(QTextStream *)in_RDI,
             (QFlagsStorageHelper<QTextDocument::MarkdownFeature,_4>)SUB84((ulong)in_RSI >> 0x20,0))
  ;
  bVar1 = QTextMarkdownWriter::writeAll
                    ((QTextMarkdownWriter *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_RSI);
  if (bVar1) {
    QString::QString((QString *)this_00,(QString *)in_RDI);
  }
  else {
    QString::QString((QString *)0x7bb5fd);
  }
  QTextMarkdownWriter::~QTextMarkdownWriter(this_00);
  QTextStream::~QTextStream((QTextStream *)&local_90);
  QString::~QString((QString *)0x7bb623);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QTextDocument::toMarkdown(QTextDocument::MarkdownFeatures features) const
{
    QString ret;
    QTextStream s(&ret);
    QTextMarkdownWriter w(s, features);
    if (w.writeAll(this))
        return ret;
    return QString();
}